

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::EnumVal> __thiscall
flatbuffers::EnumVal::Serialize(EnumVal *this,FlatBufferBuilder *builder,Parser *parser)

{
  Offset<flatbuffers::String> name;
  Offset<reflection::Type> union_type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<reflection::EnumVal> OVar1;
  
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,&this->name);
  union_type = Type::Serialize(&this->union_type,builder);
  attributes = SerializeAttributesCommon(&this->attributes,builder,parser);
  documentation.o = 0;
  if (((parser->opts).binary_schema_comments == true) &&
     (documentation.o = 0,
     (this->doc_comment).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     (this->doc_comment).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    documentation =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&this->doc_comment);
  }
  OVar1 = reflection::CreateEnumVal(builder,name,this->value,union_type,documentation,attributes);
  return (Offset<reflection::EnumVal>)OVar1.o;
}

Assistant:

Offset<reflection::EnumVal> EnumVal::Serialize(FlatBufferBuilder *builder,
                                               const Parser &parser) const {
  const auto name__ = builder->CreateString(name);
  const auto type__ = union_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  return reflection::CreateEnumVal(*builder, name__, value, type__, docs__,
                                   attr__);
}